

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__seek_bits(ma_dr_flac_bs *bs,size_t bitsToSeek)

{
  ma_uint64 *pResultOut;
  ulong in_RSI;
  ma_dr_flac_bs *in_RDI;
  ma_uint8 bin_2;
  ma_uint8 bin_1;
  ma_uint64 bin;
  ma_uint8 *in_stack_ffffffffffffffe0;
  uint uVar1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_bool32 mVar2;
  
  if (0x40 - (ulong)in_RDI->consumedBits < in_RSI) {
    uVar1 = in_RDI->consumedBits;
    in_RDI->consumedBits = in_RDI->consumedBits + (0x40 - in_RDI->consumedBits);
    in_RDI->cache = 0;
    for (pResultOut = (ma_uint64 *)(in_RSI - (0x40 - (ulong)uVar1)); (ma_uint64 *)0x3f < pResultOut;
        pResultOut = pResultOut + -8) {
      mVar2 = ma_dr_flac__read_uint64
                        ((ma_dr_flac_bs *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (uint)((ulong)in_RDI >> 0x20),pResultOut);
      if (mVar2 == 0) {
        return 0;
      }
    }
    for (; uVar1 = (uint)((ulong)pResultOut >> 0x20), (ma_uint64 *)0x7 < pResultOut;
        pResultOut = pResultOut + -1) {
      mVar2 = ma_dr_flac__read_uint8(in_RDI,uVar1,in_stack_ffffffffffffffe0);
      if (mVar2 == 0) {
        return 0;
      }
    }
    if ((pResultOut == (ma_uint64 *)0x0) ||
       (mVar2 = ma_dr_flac__read_uint8(in_RDI,uVar1,in_stack_ffffffffffffffe0), mVar2 != 0)) {
      mVar2 = 1;
    }
    else {
      mVar2 = 0;
    }
  }
  else {
    in_RDI->consumedBits = (int)in_RSI + in_RDI->consumedBits;
    in_RDI->cache = in_RDI->cache << ((byte)in_RSI & 0x3f);
    mVar2 = 1;
  }
  return mVar2;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_bits(ma_dr_flac_bs* bs, size_t bitsToSeek)
{
    if (bitsToSeek <= MA_DR_FLAC_CACHE_L1_BITS_REMAINING(bs)) {
        bs->consumedBits += (ma_uint32)bitsToSeek;
        bs->cache <<= bitsToSeek;
        return MA_TRUE;
    } else {
        bitsToSeek       -= MA_DR_FLAC_CACHE_L1_BITS_REMAINING(bs);
        bs->consumedBits += MA_DR_FLAC_CACHE_L1_BITS_REMAINING(bs);
        bs->cache         = 0;
#ifdef MA_64BIT
        while (bitsToSeek >= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs)) {
            ma_uint64 bin;
            if (!ma_dr_flac__read_uint64(bs, MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs), &bin)) {
                return MA_FALSE;
            }
            bitsToSeek -= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs);
        }
#else
        while (bitsToSeek >= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs)) {
            ma_uint32 bin;
            if (!ma_dr_flac__read_uint32(bs, MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs), &bin)) {
                return MA_FALSE;
            }
            bitsToSeek -= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs);
        }
#endif
        while (bitsToSeek >= 8) {
            ma_uint8 bin;
            if (!ma_dr_flac__read_uint8(bs, 8, &bin)) {
                return MA_FALSE;
            }
            bitsToSeek -= 8;
        }
        if (bitsToSeek > 0) {
            ma_uint8 bin;
            if (!ma_dr_flac__read_uint8(bs, (ma_uint32)bitsToSeek, &bin)) {
                return MA_FALSE;
            }
            bitsToSeek = 0;
        }
        MA_DR_FLAC_ASSERT(bitsToSeek == 0);
        return MA_TRUE;
    }
}